

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
TasGrid::Optimizer::getGreedyNodes<(TasGrid::TypeOneDRule)17>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,int n)

{
  ulong uVar1;
  ulong __n;
  double local_40;
  vector<double,_std::allocator<double>_> precomputed;
  
  getPrecomputed(&precomputed,rule_minlebesgue);
  uVar1 = (long)precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  __n = (ulong)n;
  if (__n <= uVar1) {
    uVar1 = __n;
  }
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)__return_storage_ptr__,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + uVar1),(allocator_type *)&local_40);
  if ((int)((ulong)((long)precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)precomputed.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < n) {
    ::std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
    for (uVar1 = (ulong)((long)precomputed.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)precomputed.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3; (int)uVar1 < n;
        uVar1 = (ulong)((int)uVar1 + 1)) {
      local_40 = getNextNode<(TasGrid::TypeOneDRule)17>(__return_storage_ptr__);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,&local_40);
    }
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&precomputed.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getGreedyNodes(int n){
    // load the first few precomputed nodes
    auto precomputed = getPrecomputed(rule);
    size_t usefirst = std::min(precomputed.size(), (size_t) n);
    std::vector<double> nodes(precomputed.begin(), precomputed.begin() + usefirst);
    if (n > (int) precomputed.size()){
        nodes.reserve((size_t) n);
        for(int i = (int) precomputed.size(); i<n; i++)
            nodes.push_back(getNextNode<rule>(nodes));
    }

    return nodes;
}